

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

int map_get(pMap map,size_t key,void *value)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = map->count;
  bVar5 = uVar1 == 0;
  if (!bVar5) {
    if (*map->keys == key) {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (uVar1 - 1 == uVar4) {
          bVar5 = true;
          goto LAB_00103fa5;
        }
        uVar3 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar3;
      } while (map->keys[lVar2] != key);
      bVar5 = uVar1 <= uVar3;
    }
    memcpy(value,(void *)(uVar3 * map->value_size + (long)map->values),map->value_size);
  }
LAB_00103fa5:
  return -(uint)bVar5;
}

Assistant:

int map_get(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(value, map->values + i * map->value_size, map->value_size);
            return MAP_SUCCESS;
        }
    }
    return MAP_FAILED;
}